

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_intersect.cpp
# Opt level: O0

int ON_Intersect(ON_Plane *plane,ON_Sphere *sphere,ON_Circle *circle)

{
  ON_3dPoint p;
  bool bVar1;
  double dVar2;
  double local_e8;
  double r1;
  undefined1 local_c0 [8];
  ON_3dPoint C1;
  double r0;
  ON_3dVector R;
  double d;
  undefined1 local_68 [8];
  ON_3dPoint circle_center;
  ON_3dPoint sphere_center;
  double tol;
  double sphere_radius;
  int rc;
  ON_Circle *circle_local;
  ON_Sphere *sphere_local;
  ON_Plane *plane_local;
  
  sphere_radius._4_4_ = 0;
  dVar2 = ABS(sphere->radius);
  sphere_center.z = dVar2 * 1.490116119385e-08;
  if (sphere_center.z < 2.3283064365386963e-10) {
    sphere_center.z = 2.3283064365386963e-10;
  }
  ON_Sphere::Center((ON_3dPoint *)&circle_center.z,sphere);
  p.y = sphere_center.x;
  p.x = circle_center.z;
  p.z = sphere_center.y;
  ON_Plane::ClosestPointTo((ON_3dPoint *)local_68,plane,p);
  R.z = ON_3dPoint::DistanceTo((ON_3dPoint *)local_68,(ON_3dPoint *)&circle_center.z);
  circle->radius = 0.0;
  bVar1 = ON_IsValid(dVar2);
  if (((bVar1) && (bVar1 = ON_IsValid(R.z), bVar1)) && (R.z <= dVar2 + sphere_center.z)) {
    if (dVar2 <= 0.0) {
      circle->radius = 0.0;
    }
    else {
      R.z = -(R.z / dVar2) * (R.z / dVar2) + 1.0;
      if (R.z <= 8.881784197001252e-16) {
        local_e8 = 0.0;
      }
      else {
        local_e8 = sqrt(R.z);
        local_e8 = dVar2 * local_e8;
      }
      circle->radius = local_e8;
    }
    if (2.3283064365386963e-10 < circle->radius) {
      sphere_radius._4_4_ = 2;
    }
    else {
      sphere_radius._4_4_ = 1;
      circle->radius = 0.0;
      ON_3dPoint::operator-
                ((ON_3dVector *)&r0,(ON_3dPoint *)local_68,(ON_3dPoint *)&circle_center.z);
      C1.z = ON_3dVector::Length((ON_3dVector *)&r0);
      if (0.0 < C1.z) {
        ON_3dVector::Unitize((ON_3dVector *)&r0);
        operator*((ON_3dVector *)&r1,dVar2,(ON_3dVector *)&r0);
        ON_3dPoint::operator+
                  ((ON_3dPoint *)local_c0,(ON_3dPoint *)&circle_center.z,(ON_3dVector *)&r1);
        dVar2 = ON_3dPoint::DistanceTo((ON_3dPoint *)local_c0,(ON_3dPoint *)&circle_center.z);
        if (ABS(sphere->radius - dVar2) < ABS(sphere->radius - C1.z)) {
          local_68 = local_c0;
          circle_center.x = C1.x;
          circle_center.y = C1.y;
        }
      }
    }
  }
  memcpy(circle,plane,0x80);
  (circle->plane).origin.x = (double)local_68;
  (circle->plane).origin.y = circle_center.x;
  (circle->plane).origin.z = circle_center.y;
  ON_Plane::UpdateEquation(&circle->plane);
  return sphere_radius._4_4_;
}

Assistant:

int ON_Intersect(
        const ON_Plane& plane,
        const ON_Sphere& sphere, 
        ON_Circle& circle
        )
{
  // 16 April 2011 Dale Lear
  //   Prior to this date, this function did not return the correct answer.

  int rc = 0;
  const double sphere_radius = fabs(sphere.radius);
  double tol = sphere_radius*ON_SQRT_EPSILON;
  if ( !(tol >= ON_ZERO_TOLERANCE) )
    tol = ON_ZERO_TOLERANCE;
  const ON_3dPoint sphere_center = sphere.Center();
  ON_3dPoint circle_center = plane.ClosestPointTo(sphere_center);
  double d = circle_center.DistanceTo(sphere_center);

  circle.radius = 0.0;

  if ( ON_IsValid(sphere_radius) && ON_IsValid(d) && d <= sphere_radius + tol )
  {
    if ( sphere_radius > 0.0 )
    {
      d /= sphere_radius;
      d = 1.0 - d*d;
      // The d > 4.0*ON_EPSILON was picked by testing spheres with
      // radius = 1 and center = (0,0,0).  Do not make 4.0*ON_EPSILON 
      // any smaller and please discuss changes with Dale Lear.
      circle.radius = (d > 4.0*ON_EPSILON) ? sphere_radius*sqrt(d) : 0.0;
    }
    else
      circle.radius = 0.0;

    if ( circle.radius <= ON_ZERO_TOLERANCE )
    {
      // return a single point
      rc = 1;
      
      circle.radius = 0.0;

      //  When tolerance is in play, put the point on the sphere.
      //  If the caller prefers the plane, then they can adjust the
      //  returned answer to get the plane.
      ON_3dVector R = circle_center - sphere_center;
      double r0 = R.Length();
      if ( r0 > 0.0 )
      {
        R.Unitize();
        ON_3dPoint C1 = sphere_center + sphere_radius*R;
        double r1 = C1.DistanceTo(sphere_center);
        if ( fabs(sphere.radius-r1) < fabs(sphere.radius-r0) )
          circle_center = C1;
      }
    }
    else 
    {
      // return a circle
      rc = 2;
    }
  }

  // Update circle's plane here in case the input plane 
  // is the circle's plane member.
  circle.plane = plane;
  circle.plane.origin = circle_center;
  circle.plane.UpdateEquation();

  return rc;
}